

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f *
Matrix4f::orthographicProjection
          (Matrix4f *__return_storage_ptr__,float left,float right,float bottom,float top,
          float zNear,float zFar,bool directX)

{
  undefined3 in_register_00000031;
  bool bVar1;
  float fVar2;
  float in_XMM0_Db;
  float fVar3;
  float in_XMM1_Db;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float in_XMM2_Db;
  float in_XMM3_Db;
  
  Matrix4f(__return_storage_ptr__,0.0);
  fVar2 = 2.0;
  __return_storage_ptr__->m_elements[0] = 2.0 / (right - left);
  __return_storage_ptr__->m_elements[5] = 2.0 / (top - bottom);
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  auVar4._0_4_ = left + right;
  auVar4._4_4_ = bottom + top;
  auVar4._8_4_ = in_XMM0_Db + in_XMM1_Db;
  auVar4._12_4_ = in_XMM2_Db + in_XMM3_Db;
  auVar5._4_4_ = bottom - top;
  auVar5._0_4_ = left - right;
  auVar5._8_4_ = in_XMM0_Db - in_XMM1_Db;
  auVar5._12_4_ = in_XMM2_Db - in_XMM3_Db;
  auVar5 = divps(auVar4,auVar5);
  *(long *)(__return_storage_ptr__->m_elements + 0xc) = auVar5._0_8_;
  bVar1 = CONCAT31(in_register_00000031,directX) == 0;
  fVar3 = zNear;
  if (bVar1) {
    fVar3 = zNear + zFar;
  }
  if (!bVar1) {
    fVar2 = 1.0;
  }
  __return_storage_ptr__->m_elements[10] = fVar2 / (zNear - zFar);
  __return_storage_ptr__->m_elements[0xe] = fVar3 / (zNear - zFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::orthographicProjection( float left, float right, float bottom, float top, float zNear, float zFar, bool directX )
{
	Matrix4f m;

	m( 0, 0 ) = 2.0f / ( right - left );
	m( 1, 1 ) = 2.0f / ( top - bottom );
	m( 3, 3 ) = 1.0f;

	m( 0, 3 ) = ( left + right ) / ( left - right );
	m( 1, 3 ) = ( top + bottom ) / ( bottom - top );

	if( directX )
	{
		m( 2, 2 ) = 1.0f / ( zNear - zFar );
		m( 2, 3 ) = zNear / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = 2.0f / ( zNear - zFar );
		m( 2, 3 ) = ( zNear + zFar ) / ( zNear - zFar );
	}

	return m;
}